

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

stumpless_param * stumpless_load_param(stumpless_param *param,char *name,char *value)

{
  _Bool _Var1;
  stumpless_param *psVar2;
  char *message;
  size_t name_length;
  size_t local_20;
  
  if (param == (stumpless_param *)0x0) {
    message = "param was NULL";
  }
  else if (name == (char *)0x0) {
    message = "name was NULL";
  }
  else {
    if (value != (char *)0x0) {
      _Var1 = validate_param_name(name,&local_20);
      if (!_Var1) {
        return (stumpless_param *)0x0;
      }
      clear_error();
      psVar2 = unchecked_load_param(param,name,local_20,value);
      return psVar2;
    }
    message = "value was NULL";
  }
  raise_argument_empty(message);
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_load_param( struct stumpless_param *param,
                      const char *name,
                      const char *value ) {
  size_t name_length;

  VALIDATE_ARG_NOT_NULL( param );
  VALIDATE_ARG_NOT_NULL( name );
  VALIDATE_ARG_NOT_NULL( value );

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return NULL;
  }

  clear_error(  );
  return unchecked_load_param( param, name, name_length, value );
}